

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_setmetatable(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint uVar2;
  uint local_d4;
  TValue local_d0;
  RecordIndex ix;
  TRef mtref;
  TRef fref;
  TRef mt;
  TRef tr;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  uVar1 = *J->base;
  uVar2 = J->base[1];
  if (((uVar1 & 0x1f000000) == 0xb000000) &&
     (((uVar2 & 0x1f000000) == 0xb000000 || ((uVar2 != 0 && ((uVar2 & 0x1f000000) == 0)))))) {
    local_d0 = *rd->argv;
    ix.oldv._0_4_ = uVar1;
    lj_record_mm_lookup(J,(RecordIndex *)&local_d0.gcr,MM_metatable);
    (J->fold).ins.field_0.ot = 0x3e09;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
    (J->fold).ins.field_0.op2 = 5;
    ix.idxchain = lj_opt_fold(J);
    local_d4 = uVar2;
    if ((uVar2 & 0x1f000000) == 0) {
      local_d4 = lj_ir_knull(J,IRT_TAB);
    }
    ix.mobj = local_d4;
    (J->fold).ins.field_0.ot = 0x4d0b;
    (J->fold).ins.field_0.op1 = (IRRef1)ix.idxchain;
    (J->fold).ins.field_0.op2 = (IRRef1)local_d4;
    lj_opt_fold(J);
    if ((uVar2 & 0x1f000000) != 0) {
      (J->fold).ins.field_0.ot = 0x580b;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
      (J->fold).ins.field_0.op2 = 0;
      lj_opt_fold(J);
    }
    *J->base = uVar1;
    J->needsnap = '\x01';
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_setmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  TRef mt = J->base[1];
  if (tref_istab(tr) && (tref_istab(mt) || (mt && tref_isnil(mt)))) {
    TRef fref, mtref;
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    lj_record_mm_lookup(J, &ix, MM_metatable); /* Guard for no __metatable. */
    fref = emitir(IRT(IR_FREF, IRT_PGC), tr, IRFL_TAB_META);
    mtref = tref_isnil(mt) ? lj_ir_knull(J, IRT_TAB) : mt;
    emitir(IRT(IR_FSTORE, IRT_TAB), fref, mtref);
    if (!tref_isnil(mt))
      emitir(IRT(IR_TBAR, IRT_TAB), tr, 0);
    J->base[0] = tr;
    J->needsnap = 1;
  }  /* else: Interpreter will throw. */
}